

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O3

bool __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::IsLinearMapping
          (TPZGeoBlend<pzgeom::TPZGeoTriangle> *this,int side)

{
  long lVar1;
  bool bVar2;
  TPZStack<int,_10> LowAllSides;
  TPZManVector<int,_10> TStack_68;
  
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&TStack_68);
  pztopology::TPZTriangle::LowerDimensionSides(side,(TPZStack<int,_10> *)&TStack_68);
  if (6 < (uint)side) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x28);
  }
  if (((uint)side < 3) || (this->fNeighbours[side - 3].fGeoElIndex == -1)) {
    bVar2 = true;
    if (0 < TStack_68.super_TPZVec<int>.fNElements) {
      lVar1 = 0;
      do {
        if ((2 < TStack_68.super_TPZVec<int>.fStore[lVar1]) &&
           (this->fNeighbours[TStack_68.super_TPZVec<int>.fStore[lVar1] - 3].fGeoElIndex != -1))
        goto LAB_00e63b19;
        lVar1 = lVar1 + 1;
      } while (TStack_68.super_TPZVec<int>.fNElements != lVar1);
    }
  }
  else {
LAB_00e63b19:
    bVar2 = false;
  }
  TPZManVector<int,_10>::~TPZManVector(&TStack_68);
  return bVar2;
}

Assistant:

bool pzgeom::TPZGeoBlend<TGeo>::IsLinearMapping(int side) const
{
    TPZStack<int> LowAllSides;
    TGeo::LowerDimensionSides(side,LowAllSides);
    if(side < 0 || side > TGeo::NSides-1)
    {
        DebugStop();
        return 0;
    }
    bool straight = true;
    
    if(side >= TGeo::NNodes && fNeighbours[side-TGeo::NNodes].ElementIndex() != -1)
    {
        straight = false;
        return straight;
    }
    for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
    {
        if(LowAllSides[lowside] >= TGeo::NNodes && fNeighbours[LowAllSides[lowside]-TGeo::NNodes].ElementIndex() != -1)
        {
            straight = false;
            return straight;
        }
    }
    return straight;
}